

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qrhiwidget.cpp
# Opt level: O0

void __thiscall QRhiWidgetPrivate::resetColorBufferObjects(QRhiWidgetPrivate *this)

{
  long in_RDI;
  parameter_type in_stack_ffffffffffffffe8;
  
  if (*(long *)(in_RDI + 0x2c8) != 0) {
    QList<QRhiResource_*>::append((QList<QRhiResource_*> *)0x347b4c,in_stack_ffffffffffffffe8);
    *(undefined8 *)(in_RDI + 0x2c8) = 0;
  }
  if (*(long *)(in_RDI + 0x2d0) != 0) {
    QList<QRhiResource_*>::append((QList<QRhiResource_*> *)0x347b86,in_stack_ffffffffffffffe8);
    *(undefined8 *)(in_RDI + 0x2d0) = 0;
  }
  if (*(long *)(in_RDI + 0x2d8) != 0) {
    QList<QRhiResource_*>::append((QList<QRhiResource_*> *)0x347bc0,in_stack_ffffffffffffffe8);
    *(undefined8 *)(in_RDI + 0x2d8) = 0;
  }
  return;
}

Assistant:

void QRhiWidgetPrivate::resetColorBufferObjects()
{
    if (colorTexture) {
        pendingDeletes.append(colorTexture);
        colorTexture = nullptr;
    }
    if (msaaColorBuffer) {
        pendingDeletes.append(msaaColorBuffer);
        msaaColorBuffer = nullptr;
    }
    if (resolveTexture) {
        pendingDeletes.append(resolveTexture);
        resolveTexture = nullptr;
    }
}